

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec_helper.c
# Opt level: O3

void helper_gvec_uqsub_d_arm(void *vd,void *vq,void *vn,void *vm,uint32_t desc)

{
  ulong *puVar1;
  byte bVar2;
  byte bVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  bool bVar10;
  
  uVar7 = desc * 8 & 0xff;
  uVar5 = uVar7 + 8;
  uVar4 = (ulong)uVar5;
  uVar8 = 0;
  bVar3 = 0;
  do {
    bVar2 = bVar3;
    uVar6 = *(ulong *)((long)vn + uVar8 * 8);
    puVar1 = (ulong *)((long)vm + uVar8 * 8);
    bVar10 = uVar6 < *puVar1;
    lVar9 = 0;
    if (!bVar10) {
      lVar9 = uVar6 - *puVar1;
    }
    *(long *)((long)vd + uVar8 * 8) = lVar9;
    uVar8 = uVar8 + 1;
    bVar3 = bVar2 | bVar10;
  } while (uVar5 >> 3 != uVar8);
  if ((bool)(bVar2 | bVar10)) {
    *(undefined4 *)vq = 1;
  }
  uVar5 = desc >> 2 & 0xf8;
  if (uVar7 < uVar5) {
    uVar6 = (ulong)(uVar5 + 8);
    uVar8 = uVar4 + 8;
    if (uVar4 + 8 < uVar6) {
      uVar8 = uVar6;
    }
    memset((void *)((long)vd + uVar4),0,(~uVar4 + uVar8 & 0xfffffffffffffff8) + 8);
    return;
  }
  return;
}

Assistant:

void HELPER(gvec_uqsub_d)(void *vd, void *vq, void *vn,
                          void *vm, uint32_t desc)
{
    intptr_t i, oprsz = simd_oprsz(desc);
    uint64_t *d = vd, *n = vn, *m = vm;
    bool q = false;

    for (i = 0; i < oprsz / 8; i++) {
        uint64_t nn = n[i], mm = m[i], dd = nn - mm;
        if (nn < mm) {
            dd = 0;
            q = true;
        }
        d[i] = dd;
    }
    if (q) {
        uint32_t *qc = vq;
        qc[0] = 1;
    }
    clear_tail(d, oprsz, simd_maxsz(desc));
}